

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O3

void __thiscall
t_php_generator::generate_php_struct_definition
          (t_php_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool is_result)

{
  int *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pptVar3;
  t_struct *ptVar4;
  bool is_result_00;
  bool bVar5;
  int iVar6;
  const_iterator f_iter;
  undefined4 extraout_var;
  ostream *poVar7;
  t_type *ptVar8;
  undefined4 extraout_var_00;
  pointer pptVar9;
  long lVar10;
  char *pcVar11;
  char *pcVar12;
  undefined3 in_register_00000081;
  string access;
  string param;
  string local_a0;
  t_struct *local_80;
  string local_78;
  undefined4 local_54;
  string local_50;
  
  local_54 = CONCAT31(in_register_00000081,is_result);
  generate_php_doc(this,out,(t_doc *)tstruct);
  std::__ostream_insert<char,std::char_traits<char>>(out,"class ",6);
  local_80 = tstruct;
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  lVar10 = *(long *)CONCAT44(extraout_var,iVar6);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,lVar10,((long *)CONCAT44(extraout_var,iVar6))[1] + lVar10);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,local_78._M_dataplus._M_p,local_78._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if (is_exception) {
    std::__ostream_insert<char,std::char_traits<char>>(out," extends ",9);
    pcVar12 = "TException";
    lVar10 = 10;
  }
  else {
    if (this->oop_ != true) goto LAB_002f74a9;
    std::__ostream_insert<char,std::char_traits<char>>(out," extends ",9);
    pcVar12 = "TBase";
    lVar10 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,pcVar12,lVar10);
LAB_002f74a9:
  if (this->json_serializable_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>(out," implements JsonSerializable",0x1c);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_78,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"static public $isValidate = ",0x1c);
  pcVar12 = "false";
  if ((ulong)this->validate_ != 0) {
    pcVar12 = "true";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar12,(ulong)this->validate_ ^ 5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  ptVar4 = local_80;
  generate_php_struct_spec(this,out,local_80);
  pptVar9 = (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar9 !=
      (ptVar4->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    paVar2 = &local_a0.field_2;
    do {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"null","");
      ptVar8 = t_type::get_true_type((*pptVar9)->type_);
      if ((((*pptVar9)->value_ != (t_const_value *)0x0) &&
          (iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xb])(ptVar8), (char)iVar6 == '\0')) &&
         (iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xc])(ptVar8), (char)iVar6 == '\0')) {
        render_const_value_abi_cxx11_(&local_a0,this,(*pptVar9)->type_,(*pptVar9)->value_);
        std::__cxx11::string::operator=((string *)&local_78,(string *)&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != paVar2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      generate_php_doc(this,out,*pptVar9);
      pcVar12 = "public";
      if ((ulong)this->getters_setters_ != 0) {
        pcVar12 = "private";
      }
      local_a0._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,pcVar12,pcVar12 + (ulong)this->getters_setters_ + 6);
      poVar7 = t_generator::indent((t_generator *)this,out);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," $",2);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar9)->name_)._M_dataplus._M_p,
                          ((*pptVar9)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar9 = (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pptVar3 = (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pcVar12 = "$vals = null";
  if (pptVar9 == pptVar3) {
    pcVar12 = "";
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar11 = pcVar12 + 0xc;
  if (pptVar9 == pptVar3) {
    pcVar11 = pcVar12;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar12,pcVar11);
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public function __construct(",0x1c);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_78._M_dataplus._M_p,local_78._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar9 = (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish != pptVar9) {
    do {
      ptVar8 = t_type::get_true_type((*pptVar9)->type_);
      if (((*pptVar9)->value_ != (t_const_value *)0x0) &&
         ((iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xb])(ptVar8), (char)iVar6 != '\0' ||
          (iVar6 = (*(ptVar8->super_t_doc)._vptr_t_doc[0xc])(ptVar8), (char)iVar6 != '\0')))) {
        poVar7 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$this->",7);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
        render_const_value_abi_cxx11_(&local_a0,this,ptVar8,(*pptVar9)->value_);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_a0._M_dataplus._M_p,local_a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p);
        }
      }
      pptVar9 = pptVar9 + 1;
    } while (pptVar9 !=
             (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (is_array($vals)) {",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    if (this->oop_ == true) {
      t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"parent::__construct(self::$_TSPEC, $vals);",0x2a);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
    }
    else {
      pptVar9 = (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pptVar9 !=
          (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"if (isset($vals[\'",0x11);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'])) {",6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + 1;
          t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"$this->",7);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = $vals[\'",10);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,((*pptVar9)->name_)._M_dataplus._M_p,
                              ((*pptVar9)->name_)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'];",3);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar1 = *piVar1 + -1;
          t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          pptVar9 = pptVar9 + 1;
        } while (pptVar9 !=
                 (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public function getName()",0x19);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return \'",8);
  iVar6 = (*(local_80->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var_00,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\';",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (this->getters_setters_ == true) {
    generate_generic_field_getters_setters(this,out,local_80);
  }
  is_result_00 = (bool)(char)local_54;
  generate_php_struct_reader(this,out,local_80,(bool)(char)local_54);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_php_struct_writer(this,out,local_80,is_result_00);
  if (this->validate_ == true && (char)local_54 == '\0') {
    pptVar9 = (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
              .super__Vector_impl_data._M_start;
    pptVar3 = (local_80->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
              .super__Vector_impl_data._M_finish;
    if (pptVar3 != pptVar9) {
      iVar6 = 0;
      do {
        iVar6 = iVar6 + (uint)((*pptVar9)->req_ == T_REQUIRED);
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 != pptVar3);
      if (iVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        generate_php_struct_read_validator(this,out,local_80);
      }
    }
  }
  bVar5 = needs_php_write_validator(this,local_80,is_result_00);
  if (bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    generate_php_struct_write_validator(this,out,local_80);
  }
  if (this->json_serializable_ == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    generate_php_struct_json_serialize(this,out,local_80,is_result_00);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_a0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_php_generator::generate_php_struct_definition(ostream& out,
                                                     t_struct* tstruct,
                                                     bool is_exception,
                                                     bool is_result) {
  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  generate_php_doc(out, tstruct);
  out << "class " << php_namespace_declaration(tstruct);
  if (is_exception) {
    out << " extends "
        << "TException";
  } else if (oop_) {
    out << " extends "
        << "TBase";
  }
  if (json_serializable_) {
    out << " implements JsonSerializable";
  }
  out << endl
      << "{" << endl;
  indent_up();

  out << indent() << "static public $isValidate = " << (validate_ ? "true" : "false") << ";" << endl << endl;

  generate_php_struct_spec(out, tstruct);

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    string dval = "null";
    t_type* t = get_true_type((*m_iter)->get_type());
    if ((*m_iter)->get_value() != nullptr && !(t->is_struct() || t->is_xception())) {
      dval = render_const_value((*m_iter)->get_type(), (*m_iter)->get_value());
    }
    generate_php_doc(out, *m_iter);
    string access = (getters_setters_) ? "private" : "public";
    indent(out) << access << " $" << (*m_iter)->get_name() << " = " << dval << ";" << endl;
  }

  out << endl;

  // Generate constructor from array
  string param = (members.size() > 0) ? "$vals = null" : "";
  out << indent() << "public function __construct(" << param << ")"<< endl
      << indent() << "{" << endl;
  indent_up();

  if (members.size() > 0) {
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
      t_type* t = get_true_type((*m_iter)->get_type());
      if ((*m_iter)->get_value() != nullptr && (t->is_struct() || t->is_xception())) {
        indent(out) << "$this->" << (*m_iter)->get_name() << " = "
                    << render_const_value(t, (*m_iter)->get_value()) << ";" << endl;
      }
    }
    out << indent() << "if (is_array($vals)) {" << endl;
    indent_up();
    if (oop_) {
      out << indent() << "parent::__construct(self::$_TSPEC, $vals);" << endl;
    } else {
      for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        out << indent() << "if (isset($vals['" << (*m_iter)->get_name() << "'])) {" << endl;

        indent_up();
        out << indent() << "$this->" << (*m_iter)->get_name() << " = $vals['"
            << (*m_iter)->get_name() << "'];" << endl;

        indent_down();
        out << indent() << "}" << endl;
      }
    }
    indent_down();
    out << indent() << "}" << endl;
  }
  scope_down(out);
  out << endl;

  out << indent() << "public function getName()" << endl
      << indent() << "{" << endl;

  indent_up();
  out << indent() << "return '" << tstruct->get_name() << "';" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;

  out << endl;
  if (getters_setters_) {
    generate_generic_field_getters_setters(out, tstruct);
  }
  generate_php_struct_reader(out, tstruct, is_result);
  out << endl;
  generate_php_struct_writer(out, tstruct, is_result);
  if (needs_php_read_validator(tstruct, is_result)) {
    out << endl;
    generate_php_struct_read_validator(out, tstruct);
  }
  if (needs_php_write_validator(tstruct, is_result)) {
    out << endl;
    generate_php_struct_write_validator(out, tstruct);
  }
  if (json_serializable_) {
    out << endl;
    generate_php_struct_json_serialize(out, tstruct, is_result);
  }

  indent_down();
  out << indent() << "}" << endl;
}